

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_state.cpp
# Opt level: O2

void __thiscall
duckdb::PartitionGlobalMergeState::PartitionGlobalMergeState
          (PartitionGlobalMergeState *this,PartitionGlobalSinkState *sink)

{
  value_type vVar1;
  int32_t val;
  TaskScheduler *this_00;
  unsigned_long uVar2;
  reference pvVar3;
  pointer pPVar4;
  reference pvVar5;
  
  this->sink = sink;
  (this->group_data).
  super_unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::TupleDataCollection_*,_std::default_delete<duckdb::TupleDataCollection>_>
  .super__Head_base<0UL,_duckdb::TupleDataCollection_*,_false>._M_head_impl =
       (TupleDataCollection *)0x0;
  this->group_idx = 0;
  (this->column_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->column_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->column_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  TupleDataParallelScanState::TupleDataParallelScanState(&this->chunk_state);
  this->memory_per_thread = sink->memory_per_thread;
  this_00 = TaskScheduler::GetScheduler(sink->context);
  val = TaskScheduler::NumberOfThreads(this_00);
  uVar2 = NumericCastImpl<unsigned_long,_int,_false>::Convert(val);
  this->num_threads = uVar2;
  (this->lock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->lock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->lock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->lock).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  *(undefined8 *)((long)&(this->lock).super___mutex_base._M_mutex.__data.__list.__prev + 1) = 0;
  *(undefined8 *)((long)&(this->lock).super___mutex_base._M_mutex.__data.__list.__next + 1) = 0;
  this->total_tasks = 0;
  this->tasks_assigned = 0;
  this->tasks_completed = 0;
  pvVar3 = vector<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>,_true>
           ::get<true>(&sink->hash_groups,this->group_idx);
  this->hash_group =
       (pvVar3->
       super_unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
       )._M_t.
       super___uniq_ptr_impl<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::PartitionGlobalHashGroup_*,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
       .super__Head_base<0UL,_duckdb::PartitionGlobalHashGroup_*,_false>._M_head_impl;
  pvVar3 = vector<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>,_true>
           ::get<true>(&sink->hash_groups,this->group_idx);
  pPVar4 = unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>
           ::operator->(pvVar3);
  this->global_sort =
       (GlobalSortState *)
       (pPVar4->global_sort).
       super_unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::GlobalSortState_*,_std::default_delete<duckdb::GlobalSortState>_>
       .super__Head_base<0UL,_duckdb::GlobalSortState_*,_false>;
  vVar1 = this->group_idx;
  pvVar5 = vector<unsigned_long,_true>::get<true>(&sink->bin_groups,0);
  *pvVar5 = vVar1;
  return;
}

Assistant:

PartitionGlobalMergeState::PartitionGlobalMergeState(PartitionGlobalSinkState &sink)
    : sink(sink), group_idx(0), memory_per_thread(sink.memory_per_thread),
      num_threads(NumericCast<idx_t>(TaskScheduler::GetScheduler(sink.context).NumberOfThreads())),
      stage(PartitionSortStage::INIT), total_tasks(0), tasks_assigned(0), tasks_completed(0) {

	const hash_t hash_bin = 0;
	hash_group = sink.hash_groups[group_idx].get();
	global_sort = sink.hash_groups[group_idx]->global_sort.get();

	sink.bin_groups[hash_bin] = group_idx;
}